

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O3

int run_test_delayed_accept(void)

{
  uv_loop_t *server;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  code *tcp;
  uv_loop_t *puVar4;
  void *pvVar5;
  undefined8 *extraout_RDX;
  sockaddr_in addr;
  sockaddr_in sStack_38;
  uv_loop_t *puStack_28;
  sockaddr_in sStack_18;
  
  puVar2 = (uv_loop_t *)malloc(0xf8);
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    if (puVar2 == (uv_loop_t *)0x0) goto LAB_0014b4ba;
    puVar3 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar3,(uv_tcp_t *)puVar2);
    if (iVar1 != 0) goto LAB_0014b4bf;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar2,(sockaddr *)&sStack_18,0);
    if (iVar1 != 0) goto LAB_0014b4c4;
    iVar1 = uv_listen((uv_stream_t *)puVar2,0x80,connection_cb);
    if (iVar1 != 0) goto LAB_0014b4c9;
    client_connect();
    client_connect();
    puVar3 = uv_default_loop();
    uv_run(puVar3,UV_RUN_DEFAULT);
    if (connection_cb_called != 2) goto LAB_0014b4ce;
    if (do_accept_called != 2) goto LAB_0014b4d3;
    if (connect_cb_called != 2) goto LAB_0014b4d8;
    if (close_cb_called != 7) goto LAB_0014b4dd;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_delayed_accept_cold_1();
LAB_0014b4ba:
    run_test_delayed_accept_cold_10();
LAB_0014b4bf:
    run_test_delayed_accept_cold_2();
LAB_0014b4c4:
    run_test_delayed_accept_cold_3();
LAB_0014b4c9:
    run_test_delayed_accept_cold_4();
LAB_0014b4ce:
    run_test_delayed_accept_cold_5();
LAB_0014b4d3:
    run_test_delayed_accept_cold_6();
LAB_0014b4d8:
    run_test_delayed_accept_cold_7();
LAB_0014b4dd:
    run_test_delayed_accept_cold_8();
  }
  run_test_delayed_accept_cold_9();
  puStack_28 = puVar2;
  tcp = (code *)malloc(0xf8);
  puVar4 = (uv_loop_t *)malloc(0x60);
  puVar3 = (uv_loop_t *)0x1a4b3a;
  puVar2 = (uv_loop_t *)0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_38);
  if (iVar1 == 0) {
    if ((uv_loop_t *)tcp == (uv_loop_t *)0x0) goto LAB_0014b568;
    if (puVar4 == (uv_loop_t *)0x0) goto LAB_0014b56d;
    puVar3 = uv_default_loop();
    puVar2 = (uv_loop_t *)tcp;
    iVar1 = uv_tcp_init(puVar3,(uv_tcp_t *)tcp);
    if (iVar1 != 0) goto LAB_0014b572;
    iVar1 = uv_tcp_connect((uv_connect_t *)puVar4,(uv_tcp_t *)tcp,(sockaddr *)&sStack_38,connect_cb)
    ;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    client_connect_cold_1();
LAB_0014b568:
    client_connect_cold_5();
LAB_0014b56d:
    client_connect_cold_4();
LAB_0014b572:
    puVar4 = puVar3;
    tcp = (code *)puVar2;
    client_connect_cold_2();
  }
  client_connect_cold_3();
  if ((int)tcp == 0) {
    puVar2 = (uv_loop_t *)0x98;
    puVar3 = (uv_loop_t *)malloc(0x98);
    if (puVar3 == (uv_loop_t *)0x0) goto LAB_0014b5dd;
    puVar2 = uv_default_loop();
    tcp = (code *)puVar3;
    iVar1 = uv_timer_init(puVar2,(uv_timer_t *)puVar3);
    if (iVar1 != 0) goto LAB_0014b5e2;
    puVar3->data = puVar4;
    tcp = do_accept;
    iVar1 = uv_timer_start((uv_timer_t *)puVar3,do_accept,1000,0);
    if (iVar1 == 0) {
      connection_cb_called = connection_cb_called + 1;
      return 0;
    }
  }
  else {
    connection_cb_cold_1();
    puVar2 = puVar4;
LAB_0014b5dd:
    connection_cb_cold_4();
LAB_0014b5e2:
    puVar3 = puVar2;
    connection_cb_cold_2();
  }
  connection_cb_cold_3();
  puVar2 = (uv_loop_t *)0xf8;
  puVar4 = (uv_loop_t *)malloc(0xf8);
  if (puVar3 == (uv_loop_t *)0x0) {
    do_accept_cold_4();
LAB_0014b677:
    do_accept_cold_3();
LAB_0014b67c:
    do_accept_cold_1();
  }
  else {
    if (puVar4 == (uv_loop_t *)0x0) goto LAB_0014b677;
    puVar2 = uv_default_loop();
    tcp = (code *)puVar4;
    iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)puVar4);
    if (iVar1 != 0) goto LAB_0014b67c;
    server = (uv_loop_t *)puVar3->data;
    tcp = (code *)puVar4;
    puVar2 = server;
    iVar1 = uv_accept((uv_stream_t *)server,(uv_stream_t *)puVar4);
    if (iVar1 == 0) {
      do_accept_called = do_accept_called + 1;
      uv_close((uv_handle_t *)puVar4,close_cb);
      if (do_accept_called == 2) {
        uv_close((uv_handle_t *)server,close_cb);
      }
      uv_close((uv_handle_t *)puVar3,close_cb);
      return extraout_EAX;
    }
  }
  do_accept_cold_2();
  if (puVar2 != (uv_loop_t *)0x0) {
    free(puVar2);
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  if (puVar2 == (uv_loop_t *)0x0) {
    connect_cb_cold_3();
  }
  else if ((int)tcp == 0) {
    tcp = alloc_cb;
    iVar1 = uv_read_start((uv_stream_t *)puVar2->pending_queue[0],alloc_cb,read_cb);
    if (iVar1 == 0) {
      connect_cb_called = connect_cb_called + 1;
      free(puVar2);
      return extraout_EAX_01;
    }
    goto LAB_0014b6df;
  }
  connect_cb_cold_1();
LAB_0014b6df:
  connect_cb_cold_2();
  pvVar5 = malloc((size_t)tcp);
  *extraout_RDX = pvVar5;
  extraout_RDX[1] = tcp;
  return (int)pvVar5;
}

Assistant:

static void start_server(void) {
  struct sockaddr_in addr;
  uv_tcp_t* server = (uv_tcp_t*)malloc(sizeof *server);
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));
  ASSERT(server != NULL);

  r = uv_tcp_init(uv_default_loop(), server);
  ASSERT(r == 0);
  r = uv_tcp_bind(server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)server, 128, connection_cb);
  ASSERT(r == 0);
}